

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall DnsStats::SubmitKeyRecord(DnsStats *this,uint8_t *content,uint32_t length)

{
  byte bVar1;
  ushort uVar2;
  
  if (8 < length) {
    bVar1 = content[3];
    SubmitRegistryNumber(this,0xd,(uint)bVar1);
    if ((bVar1 == 2) &&
       (uVar2 = *(ushort *)(content + 4) << 8 | *(ushort *)(content + 4) >> 8, uVar2 < 0x10)) {
      SubmitRegistryNumber(this,0xe,(uint)uVar2);
      if (uVar2 - 1 < 2) {
        SubmitRegistryNumber
                  (this,0x11,
                   (uint)(ushort)(*(ushort *)(content + 6) << 8 | *(ushort *)(content + 6) >> 8));
        return;
      }
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitKeyRecord(uint8_t * content, uint32_t length)
{
    if (length > 8)
    {
        uint32_t algorithm = content[3];
        SubmitRegistryNumber(REGISTRY_DNSSEC_Algorithm_Numbers, algorithm);

        if (algorithm == 2)
        {
            uint32_t prime_length = (content[4] << 8) | content[5];
            if (prime_length < 16)
            {
                SubmitRegistryNumber(REGISTRY_DNSSEC_KEY_Prime_Lengths, prime_length);

                if (prime_length == 1 || prime_length == 2)
                {
                    uint32_t well_known_prime = (content[6] << 8) | content[7];
                    SubmitRegistryNumber(REGISTRY_DNSSEC_KEY_Well_Known_Primes, well_known_prime);
                }
            }
        }
    }
}